

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterFinishAddColumn(Parse *pParse,Token *pColDef)

{
  undefined4 uVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  Column *pCStack_70;
  int savedDbFlags;
  char *zEnd;
  sqlite3_value *pVal;
  sqlite3 *db;
  Expr *pDflt;
  Column *pCol;
  char *zCol;
  char *zTab;
  char *zDb;
  Table *pTStack_28;
  int iDb;
  Table *pTab;
  Table *pNew;
  Token *pColDef_local;
  Parse *pParse_local;
  
  pVal = (sqlite3_value *)pParse->db;
  if ((pParse->nErr == 0) && (((sqlite3 *)pVal)->mallocFailed == '\0')) {
    pTab = pParse->pNewTable;
    pNew = (Table *)pColDef;
    pColDef_local = (Token *)pParse;
    zDb._4_4_ = sqlite3SchemaToIndex((sqlite3 *)pVal,pTab->pSchema);
    zTab = *(char **)(*(long *)&pVal->n + (long)zDb._4_4_ * 0x20);
    zCol = pTab->zName + 0x10;
    pDflt = (Expr *)(pTab->aCol + (pTab->nCol + -1));
    db = (sqlite3 *)(pDflt->u).zToken;
    pTStack_28 = sqlite3FindTable((sqlite3 *)pVal,zCol,zTab);
    iVar2 = sqlite3AuthCheck((Parse *)pColDef_local,0x1a,zTab,pTStack_28->zName,(char *)0x0);
    if (iVar2 == 0) {
      if ((db != (sqlite3 *)0x0) && (*(char *)&db->pVfs == 'b')) {
        db = (sqlite3 *)0x0;
      }
      if ((pDflt->nHeight & 0x10000) == 0) {
        if (pTab->pIndex == (Index *)0x0) {
          if (((((ulong)pVal->xDel & 0x4000000000000) == 0) || (pTab->pFKey == (FKey *)0x0)) ||
             (db == (sqlite3 *)0x0)) {
            if (((char)pDflt->nHeight == '\0') || (db != (sqlite3 *)0x0)) {
              if (db != (sqlite3 *)0x0) {
                iVar2 = sqlite3ValueFromExpr
                                  ((sqlite3 *)pVal,(Expr *)db,'\x01','b',(sqlite3_value **)&zEnd);
                if (iVar2 != 0) {
                  *(undefined1 *)&pVal[1].u = 1;
                  return;
                }
                if (zEnd == (char *)0x0) {
                  sqlite3ErrorMsg((Parse *)pColDef_local,
                                  "Cannot add a column with non-constant default");
                  return;
                }
                sqlite3ValueFree((sqlite3_value *)zEnd);
              }
              pCol = (Column *)sqlite3DbStrNDup((sqlite3 *)pVal,pNew->zName,*(int *)&pNew->aCol);
              if (pCol != (Column *)0x0) {
                uVar1 = *(undefined4 *)((long)&pVal->xDel + 4);
                pCStack_70 = (Column *)((long)&pCol->zName + (ulong)(*(int *)&pNew->aCol - 1));
                while( true ) {
                  bVar4 = false;
                  if ((pCol < pCStack_70) && (bVar4 = true, *(char *)&pCStack_70->zName != ';')) {
                    bVar4 = (""[*(byte *)&pCStack_70->zName] & 1) != 0;
                  }
                  if (!bVar4) break;
                  *(char *)&pCStack_70->zName = '\0';
                  pCStack_70 = (Column *)&pCStack_70[-1].field_0x2f;
                }
                *(uint *)((long)&pVal->xDel + 4) = *(uint *)((long)&pVal->xDel + 4) | 0x100000;
                pcVar3 = "sqlite_master";
                if (zDb._4_4_ == 1) {
                  pcVar3 = "sqlite_temp_master";
                }
                sqlite3NestedParse((Parse *)pColDef_local,
                                   "UPDATE \"%w\".%s SET sql = substr(sql,1,%d) || \', \' || %Q || substr(sql,%d) WHERE type = \'table\' AND name = %Q"
                                   ,zTab,pcVar3,(ulong)(uint)pTab->addColOffset,pCol,
                                   pTab->addColOffset + 1,zCol);
                sqlite3DbFree((sqlite3 *)pVal,pCol);
                *(undefined4 *)((long)&pVal->xDel + 4) = uVar1;
              }
              iVar2 = 2;
              if (db != (sqlite3 *)0x0) {
                iVar2 = 3;
              }
              sqlite3MinimumFileFormat((Parse *)pColDef_local,zDb._4_4_,iVar2);
              reloadTableSchema((Parse *)pColDef_local,pTStack_28,pTStack_28->zName);
            }
            else {
              sqlite3ErrorMsg((Parse *)pColDef_local,
                              "Cannot add a NOT NULL column with default value NULL");
            }
          }
          else {
            sqlite3ErrorMsg((Parse *)pColDef_local,
                            "Cannot add a REFERENCES column with non-NULL default value");
          }
        }
        else {
          sqlite3ErrorMsg((Parse *)pColDef_local,"Cannot add a UNIQUE column");
        }
      }
      else {
        sqlite3ErrorMsg((Parse *)pColDef_local,"Cannot add a PRIMARY KEY column");
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterFinishAddColumn(Parse *pParse, Token *pColDef){
  Table *pNew;              /* Copy of pParse->pNewTable */
  Table *pTab;              /* Table being altered */
  int iDb;                  /* Database number */
  const char *zDb;          /* Database name */
  const char *zTab;         /* Table name */
  char *zCol;               /* Null-terminated column definition */
  Column *pCol;             /* The new column */
  Expr *pDflt;              /* Default value for the new column */
  sqlite3 *db;              /* The database connection; */

  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ) return;
  pNew = pParse->pNewTable;
  assert( pNew );

  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pNew->pSchema);
  zDb = db->aDb[iDb].zName;
  zTab = &pNew->zName[16];  /* Skip the "sqlite_altertab_" prefix on the name */
  pCol = &pNew->aCol[pNew->nCol-1];
  pDflt = pCol->pDflt;
  pTab = sqlite3FindTable(db, zTab, zDb);
  assert( pTab );

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    return;
  }
#endif

  /* If the default value for the new column was specified with a 
  ** literal NULL, then set pDflt to 0. This simplifies checking
  ** for an SQL NULL default below.
  */
  if( pDflt && pDflt->op==TK_NULL ){
    pDflt = 0;
  }

  /* Check that the new column is not specified as PRIMARY KEY or UNIQUE.
  ** If there is a NOT NULL constraint, then the default value for the
  ** column must not be NULL.
  */
  if( pCol->colFlags & COLFLAG_PRIMKEY ){
    sqlite3ErrorMsg(pParse, "Cannot add a PRIMARY KEY column");
    return;
  }
  if( pNew->pIndex ){
    sqlite3ErrorMsg(pParse, "Cannot add a UNIQUE column");
    return;
  }
  if( (db->flags&SQLITE_ForeignKeys) && pNew->pFKey && pDflt ){
    sqlite3ErrorMsg(pParse, 
        "Cannot add a REFERENCES column with non-NULL default value");
    return;
  }
  if( pCol->notNull && !pDflt ){
    sqlite3ErrorMsg(pParse, 
        "Cannot add a NOT NULL column with default value NULL");
    return;
  }

  /* Ensure the default expression is something that sqlite3ValueFromExpr()
  ** can handle (i.e. not CURRENT_TIME etc.)
  */
  if( pDflt ){
    sqlite3_value *pVal;
    if( sqlite3ValueFromExpr(db, pDflt, SQLITE_UTF8, SQLITE_AFF_NONE, &pVal) ){
      db->mallocFailed = 1;
      return;
    }
    if( !pVal ){
      sqlite3ErrorMsg(pParse, "Cannot add a column with non-constant default");
      return;
    }
    sqlite3ValueFree(pVal);
  }

  /* Modify the CREATE TABLE statement. */
  zCol = sqlite3DbStrNDup(db, (char*)pColDef->z, pColDef->n);
  if( zCol ){
    char *zEnd = &zCol[pColDef->n-1];
    int savedDbFlags = db->flags;
    while( zEnd>zCol && (*zEnd==';' || sqlite3Isspace(*zEnd)) ){
      *zEnd-- = '\0';
    }
    db->flags |= SQLITE_PreferBuiltin;
    sqlite3NestedParse(pParse, 
        "UPDATE \"%w\".%s SET "
          "sql = substr(sql,1,%d) || ', ' || %Q || substr(sql,%d) "
        "WHERE type = 'table' AND name = %Q", 
      zDb, SCHEMA_TABLE(iDb), pNew->addColOffset, zCol, pNew->addColOffset+1,
      zTab
    );
    sqlite3DbFree(db, zCol);
    db->flags = savedDbFlags;
  }

  /* If the default value of the new column is NULL, then set the file
  ** format to 2. If the default value of the new column is not NULL,
  ** the file format becomes 3.
  */
  sqlite3MinimumFileFormat(pParse, iDb, pDflt ? 3 : 2);

  /* Reload the schema of the modified table. */
  reloadTableSchema(pParse, pTab, pTab->zName);
}